

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int handle_handshake_record
              (ptls_t *tls,
              _func_int_ptls_t_ptr_ptls_message_emitter_t_ptr_ptls_iovec_t_int_ptls_handshake_properties_t_ptr
              *cb,ptls_message_emitter_t *emitter,st_ptls_record_t *rec,
              ptls_handshake_properties_t *properties)

{
  ptls_buffer_t *buf;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  uint8_t *puVar5;
  uint8_t *__src;
  ptls_iovec_t pVar6;
  
  if (rec->type != '\x16') {
    return 0x32;
  }
  buf = &(tls->recvbuf).mess;
  if ((tls->recvbuf).mess.base == (uint8_t *)0x0) {
    __src = rec->fragment;
    sVar4 = rec->length;
  }
  else {
    uVar2 = tls->ctx->max_buffer_size;
    if ((uVar2 != 0) && (uVar2 < (tls->recvbuf).mess.off + rec->length)) {
      return 0x28;
    }
    iVar1 = ptls_buffer_reserve(buf,rec->length);
    if (iVar1 != 0) {
      return iVar1;
    }
    memcpy((tls->recvbuf).mess.base + (tls->recvbuf).mess.off,rec->fragment,rec->length);
    __src = (tls->recvbuf).mess.base;
    sVar4 = (tls->recvbuf).mess.off + rec->length;
    (tls->recvbuf).mess.off = sVar4;
  }
  puVar5 = __src + sVar4;
  iVar1 = 0x202;
  for (; uVar2 = (long)puVar5 - (long)__src, 3 < (long)uVar2; __src = __src + uVar3) {
    uVar3 = (ulong)((uint)__src[2] << 8 | (uint)__src[1] << 0x10) + (ulong)__src[3] + 4;
    if (uVar2 < uVar3) break;
    pVar6.len = uVar3;
    pVar6.base = __src;
    iVar1 = (*cb)(tls,emitter,pVar6,(uint)(uVar2 == uVar3),properties);
    if (((iVar1 != 0) && (iVar1 != 0x202)) && (iVar1 != 0x20b)) goto LAB_0010a545;
  }
  if (__src == puVar5) {
LAB_0010a545:
    ptls_buffer_dispose(buf);
  }
  else {
    uVar3 = tls->ctx->max_buffer_size;
    iVar1 = 0x28;
    if ((uVar3 == 0) || (uVar2 <= uVar3)) {
      if (buf->base == (uint8_t *)0x0) {
        (tls->recvbuf).mess.base = "";
        (tls->recvbuf).mess.capacity = 0;
        (tls->recvbuf).mess.off = 0;
        (tls->recvbuf).mess.is_allocated = '\0';
        (tls->recvbuf).mess.align_bits = '\0';
        iVar1 = ptls_buffer_reserve(buf,uVar2);
        if (iVar1 != 0) {
          return iVar1;
        }
        memcpy(buf->base,__src,uVar2);
      }
      else {
        memmove(buf->base,__src,uVar2);
      }
      (tls->recvbuf).mess.off = uVar2;
      iVar1 = 0x202;
    }
  }
  return iVar1;
}

Assistant:

static int handle_handshake_record(ptls_t *tls,
                                   int (*cb)(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                                             int is_end_of_record, ptls_handshake_properties_t *properties),
                                   ptls_message_emitter_t *emitter, struct st_ptls_record_t *rec,
                                   ptls_handshake_properties_t *properties)
{
    int ret;

    /* handshake */
    if (rec->type != PTLS_CONTENT_TYPE_HANDSHAKE)
        return PTLS_ALERT_DECODE_ERROR;

    /* flatten the unhandled messages */
    const uint8_t *src, *src_end;
    if (tls->recvbuf.mess.base == NULL) {
        src = rec->fragment;
        src_end = src + rec->length;
    } else {
        if (message_buffer_is_overflow(tls->ctx, tls->recvbuf.mess.off + rec->length))
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(&tls->recvbuf.mess, rec->length)) != 0)
            return ret;
        memcpy(tls->recvbuf.mess.base + tls->recvbuf.mess.off, rec->fragment, rec->length);
        tls->recvbuf.mess.off += rec->length;
        src = tls->recvbuf.mess.base;
        src_end = src + tls->recvbuf.mess.off;
    }

    /* handle the messages */
    ret = PTLS_ERROR_IN_PROGRESS;
    while (src_end - src >= 4) {
        size_t mess_len = 4 + ntoh24(src + 1);
        if (src_end - src < (int)mess_len)
            break;
        ret = cb(tls, emitter, ptls_iovec_init(src, mess_len), src_end - src == mess_len, properties);
        switch (ret) {
        case 0:
        case PTLS_ERROR_ASYNC_OPERATION:
        case PTLS_ERROR_IN_PROGRESS:
            break;
        default:
            ptls_buffer_dispose(&tls->recvbuf.mess);
            return ret;
        }
        src += mess_len;
    }

    /* keep last partial message in buffer */
    if (src != src_end) {
        size_t new_size = src_end - src;
        if (message_buffer_is_overflow(tls->ctx, new_size))
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if (tls->recvbuf.mess.base == NULL) {
            ptls_buffer_init(&tls->recvbuf.mess, "", 0);
            if ((ret = ptls_buffer_reserve(&tls->recvbuf.mess, new_size)) != 0)
                return ret;
            memcpy(tls->recvbuf.mess.base, src, new_size);
        } else {
            memmove(tls->recvbuf.mess.base, src, new_size);
        }
        tls->recvbuf.mess.off = new_size;
        ret = PTLS_ERROR_IN_PROGRESS;
    } else {
        ptls_buffer_dispose(&tls->recvbuf.mess);
    }

    return ret;
}